

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_bind_zeroblob64(sqlite3_stmt *pStmt,int i,sqlite3_uint64 n)

{
  int iVar1;
  ulong in_RDX;
  undefined4 in_ESI;
  sqlite3 *in_RDI;
  Vdbe *p;
  int rc;
  undefined4 in_stack_fffffffffffffff0;
  
  sqlite3_mutex_enter((sqlite3_mutex *)0x141657);
  if (in_RDX <= (ulong)(long)*(int *)&in_RDI->pVfs->xCurrentTimeInt64) {
    sqlite3_bind_zeroblob
              ((sqlite3_stmt *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(int)(in_RDX >> 0x20),
               (int)in_RDX);
  }
  iVar1 = sqlite3ApiExit(in_RDI,0);
  sqlite3_mutex_leave((sqlite3_mutex *)0x1416b6);
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_bind_zeroblob64(sqlite3_stmt *pStmt, int i, sqlite3_uint64 n){
  int rc;
  Vdbe *p = (Vdbe *)pStmt;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( p==0 ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(p->db->mutex);
  if( n>(u64)p->db->aLimit[SQLITE_LIMIT_LENGTH] ){
    rc = SQLITE_TOOBIG;
  }else{
    assert( (n & 0x7FFFFFFF)==n );
    rc = sqlite3_bind_zeroblob(pStmt, i, n);
  }
  rc = sqlite3ApiExit(p->db, rc);
  sqlite3_mutex_leave(p->db->mutex);
  return rc;
}